

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O2

int h264_cabac_bypass(bitstream *str,h264_cabac_context *cabac,uint32_t *binVal)

{
  int iVar1;
  uint uVar2;
  uint32_t tmp;
  
  uVar2 = cabac->codIOffset * 2;
  cabac->codIOffset = uVar2;
  if (str->dir == VS_ENCODE) {
    if (*binVal != 0) {
      uVar2 = uVar2 + cabac->codIRange;
      cabac->codIOffset = uVar2;
    }
    if (uVar2 < 0x200) {
      iVar1 = put_bit(str,cabac,0);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else if (uVar2 < 0x400) {
      cabac->bitsOutstanding = cabac->bitsOutstanding + 1;
      cabac->codIOffset = uVar2 - 0x200;
    }
    else {
      iVar1 = put_bit(str,cabac,1);
      if (iVar1 != 0) {
        return 1;
      }
      cabac->codIOffset = cabac->codIOffset - 0x400;
    }
  }
  else {
    iVar1 = vs_u(str,&tmp,1);
    if (iVar1 != 0) {
      return 1;
    }
    uVar2 = cabac->codIOffset | tmp;
    cabac->codIOffset = uVar2;
    if (uVar2 < cabac->codIRange) {
      *binVal = 0;
    }
    else {
      *binVal = 1;
      cabac->codIOffset = cabac->codIOffset - cabac->codIRange;
    }
  }
  cabac->BinCount = cabac->BinCount + 1;
  return 0;
}

Assistant:

int h264_cabac_bypass(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t *binVal) {
	cabac->codIOffset <<= 1;
	if (str->dir == VS_ENCODE) {
		if (*binVal)
			cabac->codIOffset += cabac->codIRange;
		if (cabac->codIOffset < 512) {
			if (put_bit(str, cabac, 0))
				return 1;
		} else if (cabac->codIOffset >= 1024) {
			if (put_bit(str, cabac, 1))
				return 1;
			cabac->codIOffset -= 1024;
		} else {
			cabac->bitsOutstanding++;
			cabac->codIOffset -= 512;
		}
	} else {
		uint32_t tmp;
		if (vs_u(str, &tmp, 1))
			return 1;
		cabac->codIOffset |= tmp;
		if (cabac->codIOffset >= cabac->codIRange) {
			*binVal = 1;
			cabac->codIOffset -= cabac->codIRange;
		} else {
			*binVal = 0;
		}
	}
	cabac->BinCount++;
	return 0;
}